

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

mbedtls_ct_condition_t
mbedtls_mpi_core_uint_le_mpi(mbedtls_mpi_uint min,mbedtls_mpi_uint *A,size_t A_limbs)

{
  mbedtls_ct_condition_t mVar1;
  mbedtls_ct_uint_t mVar2;
  ulong uVar3;
  
  mVar1 = mbedtls_ct_uint_ge(*A,min);
  mVar2 = mbedtls_ct_zero;
  for (uVar3 = 1; uVar3 < A_limbs; uVar3 = uVar3 + 1) {
    mVar2 = mVar2 | (long)(-((A[uVar3] ^ mbedtls_ct_zero) >> 1) | -(A[uVar3] ^ mbedtls_ct_zero)) >>
                    0x3f;
  }
  return mVar2 | mVar1;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_uint_le_mpi(mbedtls_mpi_uint min,
                                                    const mbedtls_mpi_uint *A,
                                                    size_t A_limbs)
{
    /* min <= least significant limb? */
    mbedtls_ct_condition_t min_le_lsl = mbedtls_ct_uint_ge(A[0], min);

    /* limbs other than the least significant one are all zero? */
    mbedtls_ct_condition_t msll_mask = MBEDTLS_CT_FALSE;
    for (size_t i = 1; i < A_limbs; i++) {
        msll_mask = mbedtls_ct_bool_or(msll_mask, mbedtls_ct_bool(A[i]));
    }

    /* min <= A iff the lowest limb of A is >= min or the other limbs
     * are not all zero. */
    return mbedtls_ct_bool_or(msll_mask, min_le_lsl);
}